

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_analyze.cpp
# Opt level: O2

Ptr equalExpress(TokenReader *tokens)

{
  Token *tokens_00;
  SimpleASTNode *pSVar1;
  invalid_argument *this;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Ptr PVar2;
  undefined1 local_d8 [8];
  Token token;
  Ptr child2;
  __shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2> local_88;
  __shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2> local_78;
  __shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2> local_68;
  undefined1 local_50 [8];
  Ptr child1;
  
  relExpress((TokenReader *)local_50);
  std::__shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2> *)tokens,
             (__shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2> *)local_50);
  tokens_00 = (Token *)((long)&token.val.field_2 + 8);
  while( true ) {
    TokenReader::peek();
    if ((*(long *)tokens == 0) || ((local_d8._0_4_ & ~INT_LITERAL_TYPE) != EQUAL_TYPE)) break;
    TokenReader::read();
    Token::operator=((Token *)local_d8,tokens_00);
    std::__cxx11::string::~string((string *)&child2);
    relExpress((TokenReader *)tokens_00);
    child1.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ = 8
    ;
    std::make_shared<SimpleASTNode,ASTNodeType_const&,std::__cxx11::string_const&>
              ((ASTNodeType *)&local_88,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&child1.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi + 4));
    std::__shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2> *)tokens,&local_88);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_88._M_refcount);
    pSVar1 = *(SimpleASTNode **)tokens;
    std::__shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_78,(__shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2> *)local_50);
    SimpleASTNode::addChild(pSVar1,(Ptr *)&local_78);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_78._M_refcount);
    if (token.val.field_2._8_8_ == 0) {
      this = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument(this,"\"==\" Light argument is required!");
      __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
    pSVar1 = *(SimpleASTNode **)tokens;
    std::__shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_68,(__shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2> *)tokens_00);
    SimpleASTNode::addChild(pSVar1,(Ptr *)&local_68);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_68._M_refcount);
    std::__shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2> *)local_50,
               (__shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2> *)tokens);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&child2);
    std::__cxx11::string::~string((string *)&token);
  }
  std::__cxx11::string::~string((string *)&token);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&child1);
  PVar2.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  PVar2.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)tokens;
  return (Ptr)PVar2.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static SimpleASTNode::Ptr equalExpress(TokenReader& tokens)
{
    SimpleASTNode::Ptr child1 = relExpress(tokens);
    SimpleASTNode::Ptr node = child1;
    while (true) {
        Token token = tokens.peek();
        if (node != nullptr && !token.isEmpty() && (token.type == TokenType::EQUAL_TYPE || token.type == TokenType::NEQUAL_TYPE)) {
            token = tokens.read();
            SimpleASTNode::Ptr child2 = relExpress(tokens);
            node = SimpleASTNode::create(ASTNodeType::EQUAL_EXP, token.val);
            node->addChild(child1);
            if (child2 != nullptr)
                node->addChild(child2);
            else
            {
                throw std::invalid_argument("\"==\" Light argument is required!");
            }
            child1 = node; //key step.
        } else {
            break;
        }
    }
    return node;
}